

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# result_interface.h
# Opt level: O3

strong_type<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void,_ezy::features::result_interface<ezy::features::optional_adapter>,_ezy::features::inherit_std_optional>
* __thiscall
ezy::features::result_interface<ezy::features::optional_adapter>::
impl<ezy::strong_type<std::optional<int>,void,ezy::features::result_interface<ezy::features::optional_adapter>,ezy::features::inherit_std_optional>>
::_impl::
map<ezy::strong_type<std::optional<std::__cxx11::string>,void,ezy::features::result_interface<ezy::features::optional_adapter>,ezy::features::inherit_std_optional>,ezy::features::optional_adapter<std::optional<std::__cxx11::string>>,ezy::strong_type<std::optional<int>,void,ezy::features::result_interface<ezy::features::optional_adapter>,ezy::features::inherit_std_optional>,ezy::to_string_fn_const&>
          (strong_type<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void,_ezy::features::result_interface<ezy::features::optional_adapter>,_ezy::features::inherit_std_optional>
           *__return_storage_ptr__,_impl *this,
          strong_type<std::optional<int>,_void,_ezy::features::result_interface<ezy::features::optional_adapter>,_ezy::features::inherit_std_optional>
          *t,to_string_fn *fn)

{
  string local_30;
  
  if (this[4] == (_impl)0x1) {
    to_string_fn::operator()(&local_30,(to_string_fn *)t,(int *)this);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p == &local_30.field_2) {
      *(undefined1 **)
       &(__return_storage_ptr__->
        super_strong_type_base<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
        ).
        super_strong_type_payload<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
        ._value.
        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
        ._M_payload.
        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
        .
        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           = (undefined1 *)
             ((long)&(__return_storage_ptr__->
                     super_strong_type_base<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                     ).
                     super_strong_type_payload<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                     ._value.
                     super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                     ._M_payload.
                     super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                     .
                     super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             + 0x10);
      *(size_type *)
       ((long)&(__return_storage_ptr__->
               super_strong_type_base<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
               ).
               super_strong_type_payload<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
               ._value.
               super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
               ._M_payload.
               super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
               .
               super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       + 0x10) = local_30.field_2._M_allocated_capacity;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->
               super_strong_type_base<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
               ).
               super_strong_type_payload<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
               ._value.
               super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
               ._M_payload.
               super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
               .
               super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       + 0x18) = local_30.field_2._8_8_;
    }
    else {
      *(pointer *)
       &(__return_storage_ptr__->
        super_strong_type_base<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
        ).
        super_strong_type_payload<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
        ._value.
        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
        ._M_payload.
        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
        .
        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           = local_30._M_dataplus._M_p;
      *(size_type *)
       ((long)&(__return_storage_ptr__->
               super_strong_type_base<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
               ).
               super_strong_type_payload<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
               ._value.
               super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
               ._M_payload.
               super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
               .
               super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       + 0x10) = local_30.field_2._M_allocated_capacity;
    }
    *(size_type *)
     ((long)&(__return_storage_ptr__->
             super_strong_type_base<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
             ).
             super_strong_type_payload<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
             ._value.
             super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
             ._M_payload.
             super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
             .
             super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
     + 8) = local_30._M_string_length;
    *(bool *)((long)&(__return_storage_ptr__->
                     super_strong_type_base<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                     ).
                     super_strong_type_payload<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                     ._value.
                     super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                     ._M_payload.
                     super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                     .
                     super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             + 0x20) = true;
  }
  else {
    *(bool *)((long)&(__return_storage_ptr__->
                     super_strong_type_base<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                     ).
                     super_strong_type_payload<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                     ._value.
                     super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                     ._M_payload.
                     super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                     .
                     super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             + 0x20) = false;
  }
  return __return_storage_ptr__;
}

Assistant:

static constexpr Result map(ST&& t, Fn&& fn)
        {
          using SourceTrait = Adapter<typename ezy::remove_cvref_t<ST>::type>;
          return detail::map<Result, SourceTrait, ResultTrait>(std::forward<ST>(t), std::forward<Fn>(fn));
        }